

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::subcase_start(XmlReporter *this,SubcaseSignature *in)

{
  XmlWriter *__a;
  long in_RSI;
  XmlReporter *in_RDI;
  String *in_stack_000000b0;
  string *in_stack_000000b8;
  XmlWriter *in_stack_000000c0;
  string *in_stack_fffffffffffffee8;
  XmlWriter *in_stack_fffffffffffffef0;
  XmlWriter *this_00;
  char *in_stack_fffffffffffffef8;
  allocator<char> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_b9 [40];
  allocator<char> local_91;
  char *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  XmlWriter *in_stack_ffffffffffffff80;
  allocator<char> local_69 [56];
  allocator<char> local_31 [33];
  long local_10;
  
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI->xml;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)in_RDI,in_stack_ffffffffffffff20);
  __a = XmlWriter::startElement(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,(allocator<char> *)__a);
  XmlWriter::writeAttribute<doctest::String>(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,(allocator<char> *)__a);
  skipPathFromFilename(in_stack_fffffffffffffef8);
  XmlWriter::writeAttribute
            (in_stack_ffffffffffffff80,(string *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
            );
  this_00 = (XmlWriter *)local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,(allocator<char> *)__a);
  line(in_RDI,*(uint *)(local_10 + 0x20));
  XmlWriter::writeAttribute<unsigned_int>
            (in_stack_000000c0,in_stack_000000b8,(uint *)in_stack_000000b0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_b9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(&local_91);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_69);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_31);
  XmlWriter::ensureTagClosed(this_00);
  return;
}

Assistant:

void subcase_start(const SubcaseSignature& in) override {
            xml.startElement("SubCase")
                    .writeAttribute("name", in.m_name)
                    .writeAttribute("filename", skipPathFromFilename(in.m_file))
                    .writeAttribute("line", line(in.m_line));
            xml.ensureTagClosed();
        }